

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::HandleAcksAndSendSubscriptionSyncsAndHeartbeats
          (PixieProvider *this,shared_ptr<bidfx_public_api::tools::Client> *client,int thread_num)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
  ack_data;
  AckMessage message;
  __atomic_base<int> local_5c;
  undefined1 local_58 [56];
  OutputStream *out;
  
  local_5c._M_i = thread_num;
  iVar2 = (*((client->
             super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->_vptr_Client[4])();
  out = (OutputStream *)CONCAT44(extraout_var,iVar2);
  while( true ) {
    bVar1 = provider::AbstractProvider::IsRunning(&this->super_AbstractProvider);
    if ((!bVar1) || (local_5c._M_i != (this->writer_thread_count_).super___atomic_base<int>._M_i))
    break;
    PollNextAck((PixieProvider *)local_58);
    if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
      TryAndWriteHeartbeat(this,out);
    }
    else {
      AckData::ToAckMessage((AckMessage *)(local_58 + 8),(AckData *)local_58._0_8_);
      WriteMessage(this,(PixieMessage *)(local_58 + 8),out);
    }
    PeriodicallyCheckSubscriptions(this,out);
    std::
    unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
    ::~unique_ptr((unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                   *)local_58);
  }
  spdlog::logger::debug<int>(Log,"writer {} finished",&local_5c._M_i);
  return;
}

Assistant:

void PixieProvider::HandleAcksAndSendSubscriptionSyncsAndHeartbeats(std::shared_ptr<Client> client, int thread_num)
{
    OutputStream& out = client -> GetOutputStream();
    while (IsRunning() && thread_num == writer_thread_count_)
    {
        try
        {
            std::unique_ptr<AckData> ack_data = PollNextAck();

            if (ack_data != nullptr)
            {
                AckMessage message = ack_data->ToAckMessage();
                WriteMessage(message, out);
            }
            else
            {
                TryAndWriteHeartbeat(out);
            }

            PeriodicallyCheckSubscriptions(out);
        }
        catch (std::ios_base::failure& e)
        {
            Log->warn("writer thread {} encountered a ios error: {}", thread_num, e.what());
            disconnection_triggered_ = true;
            break;
        }
    }

    Log->debug("writer {} finished", thread_num);
}